

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

Transform * __thiscall sf::View::getTransform(View *this)

{
  float *in_RDI;
  double dVar1;
  float d;
  float c;
  float b;
  float a;
  float ty;
  float tx;
  float sine;
  float cosine;
  float angle;
  Transform local_6c;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  if (((uint)in_RDI[0x29] & 1) == 0) {
    local_c = (in_RDI[4] * 3.1415927) / 180.0;
    dVar1 = std::cos((double)(ulong)(uint)local_c);
    local_10 = SUB84(dVar1,0);
    dVar1 = std::sin((double)(ulong)(uint)local_c);
    local_14 = SUB84(dVar1,0);
    local_18 = -*in_RDI * local_10 + -(in_RDI[1] * local_14) + *in_RDI;
    local_1c = *in_RDI * local_14 + -(in_RDI[1] * local_10) + in_RDI[1];
    local_20 = 2.0 / in_RDI[2];
    local_24 = -2.0 / in_RDI[3];
    local_28 = -local_20 * *in_RDI;
    local_2c = -local_24 * in_RDI[1];
    Transform::Transform
              (&local_6c,local_20 * local_10,local_20 * local_14,local_20 * local_18 + local_28,
               -local_24 * local_14,local_24 * local_10,local_24 * local_1c + local_2c,0.0,0.0,1.0);
    memcpy(in_RDI + 9,&local_6c,0x40);
    *(undefined1 *)(in_RDI + 0x29) = 1;
  }
  return (Transform *)(in_RDI + 9);
}

Assistant:

const Transform& View::getTransform() const
{
    // Recompute the matrix if needed
    if (!m_transformUpdated)
    {
        // Rotation components
        float angle  = m_rotation * 3.141592654f / 180.f;
        float cosine = static_cast<float>(std::cos(angle));
        float sine   = static_cast<float>(std::sin(angle));
        float tx     = -m_center.x * cosine - m_center.y * sine + m_center.x;
        float ty     =  m_center.x * sine - m_center.y * cosine + m_center.y;

        // Projection components
        float a =  2.f / m_size.x;
        float b = -2.f / m_size.y;
        float c = -a * m_center.x;
        float d = -b * m_center.y;

        // Rebuild the projection matrix
        m_transform = Transform( a * cosine, a * sine,   a * tx + c,
                                -b * sine,   b * cosine, b * ty + d,
                                 0.f,        0.f,        1.f);
        m_transformUpdated = true;
    }

    return m_transform;
}